

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JITRecyclableObject.h
# Opt level: O1

JITJavascriptString * JITJavascriptString::FromVar(Var var)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  bVar2 = Js::VarIs<Js::RecyclableObject>(var);
  if ((!bVar2) || (**(int **)((long)var + 8) != 7)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/JITRecyclableObject.h"
                       ,0x3c,"(Is(var))","Is(var)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  return (JITJavascriptString *)var;
}

Assistant:

static JITJavascriptString * FromVar(Js::Var var)
    {
        Assert(offsetof(JITJavascriptString, m_pszValue) == Js::JavascriptString::GetOffsetOfpszValue());
        Assert(offsetof(JITJavascriptString, m_charLength) == Js::JavascriptString::GetOffsetOfcharLength());
        AssertOrFailFast(Is(var));

        return reinterpret_cast<JITJavascriptString*>(var);
    }